

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetresizehandler.cpp
# Opt level: O0

void __thiscall QWidgetResizeHandler::mouseMoveEvent(QWidgetResizeHandler *this,QMouseEvent *e)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  QWidget *pQVar5;
  int *piVar6;
  QRect *pQVar7;
  QWidgetResizeHandler *in_RDI;
  long in_FS_OFFSET;
  QPointF QVar8;
  int mh;
  int mw;
  QRect geom;
  QPoint mp;
  QSize mpsize;
  QSize maxsize;
  QSize ms;
  QRect desktop;
  QPoint pp;
  QPoint p;
  QPoint globalPos;
  QPoint pos;
  undefined2 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9a;
  undefined1 in_stack_fffffffffffffc9b;
  byte bVar9;
  int in_stack_fffffffffffffc9c;
  int in_stack_fffffffffffffca0;
  WidgetAttribute in_stack_fffffffffffffca4;
  int in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcac;
  int in_stack_fffffffffffffcb0;
  int in_stack_fffffffffffffcb4;
  int in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  QRect *this_00;
  QRect *r;
  undefined8 in_stack_fffffffffffffce8;
  MousePosition m;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  byte local_2d9;
  QRect local_290;
  QSize local_278;
  QSize local_270;
  QSize local_268;
  QSize local_260;
  QSize local_258;
  QPoint local_250;
  undefined8 local_248;
  undefined8 local_240;
  QPoint local_230;
  undefined8 local_228;
  undefined8 local_220;
  QPoint local_218;
  undefined8 local_208;
  undefined8 local_200;
  QPoint local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  QPoint local_1d8;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_188;
  undefined8 local_180;
  QPoint local_178;
  undefined8 local_170;
  undefined8 local_168;
  QPoint local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined1 *local_148;
  undefined1 *puStack_140;
  QWidget *local_130;
  undefined1 local_128 [16];
  QSize local_118;
  QSize local_110;
  QSize local_108;
  QSize local_100;
  QSize local_f0;
  QSize local_e8;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  undefined1 local_c0 [16];
  QLatin1StringView local_b0;
  QPoint local_88;
  QPoint local_80;
  QRect local_78;
  qreal local_68;
  qreal local_60;
  qreal local_58;
  qreal local_50;
  QPoint local_48;
  QPoint local_40;
  QRect local_38;
  qreal local_28;
  qreal local_20;
  QPoint local_18;
  QPoint local_10;
  long local_8;
  
  m = (MousePosition)((ulong)in_stack_fffffffffffffce8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  QVar8 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x6693d4);
  local_20 = QVar8.yp;
  local_28 = QVar8.xp;
  local_18 = QPointF::toPoint((QPointF *)
                              CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  local_10 = QWidget::mapFromGlobal
                       ((QWidget *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                        (QPoint *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  if ((((byte)in_RDI[0x40] >> 1 & 1) != 0) || (((byte)in_RDI[0x40] & 1) != 0)) {
    if ((*(int *)(in_RDI + 0x30) != 9) &&
       (bVar1 = QWidget::testAttribute
                          ((QWidget *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                           in_stack_fffffffffffffca4), !bVar1)) {
      local_40 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      bVar1 = QWidget::isWindow((QWidget *)
                                CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
      if ((bVar1) || (pQVar5 = QWidget::parentWidget((QWidget *)0x669827), pQVar5 == (QWidget *)0x0)
         ) {
        QVar8 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x6698a6);
        local_60 = QVar8.yp;
        local_68 = QVar8.xp;
        local_40 = QPointF::toPoint((QPointF *)
                                    CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      }
      else {
        QWidget::parentWidget((QWidget *)0x66983e);
        QVar8 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x669853);
        local_50 = QVar8.yp;
        local_58 = QVar8.xp;
        local_48 = QPointF::toPoint((QPointF *)
                                    CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
        local_40 = QWidget::mapFromGlobal
                             ((QWidget *)
                              CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                              (QPoint *)
                              CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      }
      bVar1 = QWidget::isWindow((QWidget *)
                                CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
      local_2d9 = 0;
      if (!bVar1) {
        QWidget::parentWidget((QWidget *)0x6698ff);
        local_78 = QWidget::rect((QWidget *)
                                 CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
        local_2d9 = QRect::contains((QPoint *)&local_78,SUB81(&local_40,0));
        local_2d9 = local_2d9 ^ 0xff;
      }
      if ((local_2d9 & 1) != 0) {
        iVar2 = QPoint::x((QPoint *)0x669954);
        if (iVar2 < 0) {
          piVar6 = QPoint::rx((QPoint *)0x669966);
          *piVar6 = 0;
        }
        iVar2 = QPoint::y((QPoint *)0x669979);
        if (iVar2 < 0) {
          piVar6 = QPoint::ry((QPoint *)0x66998b);
          *piVar6 = 0;
        }
        iVar2 = QPoint::x((QPoint *)0x66999e);
        QWidget::parentWidget((QWidget *)0x6699b8);
        iVar3 = QWidget::width((QWidget *)0x6699c0);
        if (iVar3 < iVar2) {
          QWidget::parentWidget((QWidget *)0x6699de);
          iVar2 = QWidget::width((QWidget *)0x6699e6);
          piVar6 = QPoint::rx((QPoint *)0x6699fa);
          *piVar6 = iVar2;
        }
        iVar2 = QPoint::y((QPoint *)0x669a10);
        QWidget::parentWidget((QWidget *)0x669a2a);
        iVar3 = QWidget::height((QWidget *)0x669a32);
        if (iVar3 < iVar2) {
          QWidget::parentWidget((QWidget *)0x669a50);
          iVar2 = QWidget::height((QWidget *)0x669a58);
          piVar6 = QPoint::ry((QPoint *)0x669a69);
          *piVar6 = iVar2;
        }
      }
      local_80 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      local_80 = ::operator+((QPoint *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0)
                             ,(QPoint *)
                              CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      local_88 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      local_88 = ::operator-((QPoint *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0)
                             ,(QPoint *)
                              CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      QGuiApplication::platformName();
      local_b0 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                            CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
      bVar1 = ::operator==((QString *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                           (QLatin1StringView *)
                           CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
      QString::~QString((QString *)0x669b25);
      if (bVar1) {
        local_c0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_c0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_c0 = (undefined1  [16])
                   QWidgetPrivate::availableScreenGeometry
                             ((QWidget *)
                              CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
        local_c4 = QPoint::x((QPoint *)0x669b7e);
        local_c8 = QRect::left((QRect *)0x669b92);
        piVar6 = qMax<int>(&local_c4,&local_c8);
        iVar2 = *piVar6;
        piVar6 = QPoint::rx((QPoint *)0x669bc1);
        *piVar6 = iVar2;
        local_cc = QPoint::y((QPoint *)0x669bd4);
        local_d0 = QRect::top((QRect *)0x669be8);
        piVar6 = qMax<int>(&local_cc,&local_d0);
        iVar2 = *piVar6;
        piVar6 = QPoint::ry((QPoint *)0x669c17);
        *piVar6 = iVar2;
        local_d4 = QPoint::x((QPoint *)0x669c2a);
        local_d8 = QRect::right((QRect *)0x669c3e);
        piVar6 = qMin<int>(&local_d4,&local_d8);
        iVar2 = *piVar6;
        piVar6 = QPoint::rx((QPoint *)0x669c6d);
        *piVar6 = iVar2;
        local_dc = QPoint::y((QPoint *)0x669c80);
        local_e0 = QRect::bottom((QRect *)0x669c94);
        piVar6 = qMin<int>(&local_dc,&local_e0);
        iVar2 = *piVar6;
        piVar6 = QPoint::ry((QPoint *)0x669cc3);
        *piVar6 = iVar2;
      }
      local_e8 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      local_e8 = qSmartMinSize((QWidget *)
                               CONCAT44(in_stack_fffffffffffffc9c,
                                        CONCAT13(in_stack_fffffffffffffc9b,
                                                 CONCAT12(in_stack_fffffffffffffc9a,
                                                          in_stack_fffffffffffffc98))));
      QSize::width((QSize *)0x669cfe);
      QSize::height((QSize *)0x669d12);
      local_f0 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      local_f0 = QWidget::maximumSize
                           ((QWidget *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0)
                           );
      if (*(long *)(in_RDI + 0x18) != *(long *)(in_RDI + 0x10)) {
        QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                     in_stack_fffffffffffffc9c,
                     CONCAT13(in_stack_fffffffffffffc9b,
                              CONCAT12(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98)));
        QSize::operator+=((QSize *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                          (QSize *)CONCAT44(in_stack_fffffffffffffc9c,
                                            CONCAT13(in_stack_fffffffffffffc9b,
                                                     CONCAT12(in_stack_fffffffffffffc9a,
                                                              in_stack_fffffffffffffc98))));
      }
      pQVar5 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
      local_100 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      QWidget::geometry(*(QWidget **)(in_RDI + 0x10));
      iVar2 = QRect::right((QRect *)0x669dfd);
      this_00 = (QRect *)&local_88;
      QPoint::x((QPoint *)0x669e13);
      QWidget::geometry(*(QWidget **)(in_RDI + 0x10));
      QRect::bottom((QRect *)0x669e3a);
      QPoint::y((QPoint *)0x669e48);
      QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                   in_stack_fffffffffffffc9c,
                   CONCAT13(in_stack_fffffffffffffc9b,
                            CONCAT12(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98)));
      local_128._8_8_ =
           QWidget::minimumSize
                     ((QWidget *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      local_118 = QSize::expandedTo((QSize *)CONCAT44(in_stack_fffffffffffffcac,
                                                      in_stack_fffffffffffffca8),
                                    (QSize *)CONCAT44(in_stack_fffffffffffffca4,
                                                      in_stack_fffffffffffffca0));
      r = (QRect *)local_128;
      QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                   in_stack_fffffffffffffc9c,
                   CONCAT13(in_stack_fffffffffffffc9b,
                            CONCAT12(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98)));
      local_110 = QSize::expandedTo((QSize *)CONCAT44(in_stack_fffffffffffffcac,
                                                      in_stack_fffffffffffffca8),
                                    (QSize *)CONCAT44(in_stack_fffffffffffffca4,
                                                      in_stack_fffffffffffffca0));
      local_108 = QSize::boundedTo((QSize *)CONCAT44(in_stack_fffffffffffffcac,
                                                     in_stack_fffffffffffffca8),
                                   (QSize *)CONCAT44(in_stack_fffffffffffffca4,
                                                     in_stack_fffffffffffffca0));
      local_130 = pQVar5;
      local_100 = local_108;
      QWidget::geometry(*(QWidget **)(in_RDI + 0x10));
      QRect::right((QRect *)0x669f29);
      QSize::width((QSize *)0x669f37);
      QWidget::geometry(*(QWidget **)(in_RDI + 0x10));
      QRect::bottom((QRect *)0x669f5e);
      QSize::height((QSize *)0x669f6c);
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                     in_stack_fffffffffffffc9c,
                     CONCAT13(in_stack_fffffffffffffc9b,
                              CONCAT12(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98)));
      local_148 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_140 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar7 = QWidget::geometry(*(QWidget **)(in_RDI + 0x10));
      local_148._0_4_ = pQVar7->x1;
      local_148._4_4_ = pQVar7->y1;
      puStack_140._0_4_ = pQVar7->x2;
      puStack_140._4_4_ = pQVar7->y2;
      switch(*(undefined4 *)(in_RDI + 0x30)) {
      case 1:
        QWidget::geometry(*(QWidget **)(in_RDI + 0x10));
        local_160 = QRect::bottomRight((QRect *)CONCAT44(in_stack_fffffffffffffc9c,
                                                         CONCAT13(in_stack_fffffffffffffc9b,
                                                                  CONCAT12(in_stack_fffffffffffffc9a
                                                                           ,
                                                  in_stack_fffffffffffffc98))));
        QRect::QRect(this_00,(QPoint *)CONCAT44(iVar2,in_stack_fffffffffffffcb8),
                     (QPoint *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
        local_148 = (undefined1 *)local_158;
        puStack_140 = (undefined1 *)local_150;
        break;
      case 2:
        QWidget::geometry(*(QWidget **)(in_RDI + 0x10));
        local_178 = QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffc9c,
                                                     CONCAT13(in_stack_fffffffffffffc9b,
                                                              CONCAT12(in_stack_fffffffffffffc9a,
                                                                       in_stack_fffffffffffffc98))))
        ;
        QRect::QRect(this_00,(QPoint *)CONCAT44(iVar2,in_stack_fffffffffffffcb8),
                     (QPoint *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
        local_148 = (undefined1 *)local_170;
        puStack_140 = (undefined1 *)local_168;
        break;
      case 3:
        in_stack_fffffffffffffcb4 = QPoint::x((QPoint *)0x66a0b9);
        QWidget::geometry(*(QWidget **)(in_RDI + 0x10));
        QRect::y((QRect *)0x66a0d8);
        QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                       in_stack_fffffffffffffc9c,
                       CONCAT13(in_stack_fffffffffffffc9b,
                                CONCAT12(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98)));
        QWidget::geometry(*(QWidget **)(in_RDI + 0x10));
        in_stack_fffffffffffffcb8 = QRect::right((QRect *)0x66a104);
        QPoint::y((QPoint *)0x66a115);
        QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                       in_stack_fffffffffffffc9c,
                       CONCAT13(in_stack_fffffffffffffc9b,
                                CONCAT12(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98)));
        QRect::QRect(this_00,(QPoint *)CONCAT44(iVar2,in_stack_fffffffffffffcb8),
                     (QPoint *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
        local_148 = (undefined1 *)local_188;
        puStack_140 = (undefined1 *)local_180;
        break;
      case 4:
        QWidget::geometry(*(QWidget **)(in_RDI + 0x10));
        in_stack_fffffffffffffcac = QRect::x((QRect *)0x66a183);
        QPoint::y((QPoint *)0x66a194);
        QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                       in_stack_fffffffffffffc9c,
                       CONCAT13(in_stack_fffffffffffffc9b,
                                CONCAT12(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98)));
        in_stack_fffffffffffffcb0 = QPoint::x((QPoint *)0x66a1b4);
        QWidget::geometry(*(QWidget **)(in_RDI + 0x10));
        QRect::bottom((QRect *)0x66a1d3);
        QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                       in_stack_fffffffffffffc9c,
                       CONCAT13(in_stack_fffffffffffffc9b,
                                CONCAT12(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98)));
        QRect::QRect(this_00,(QPoint *)CONCAT44(iVar2,in_stack_fffffffffffffcb8),
                     (QPoint *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
        local_148 = (undefined1 *)local_1a8;
        puStack_140 = (undefined1 *)local_1a0;
        break;
      case 5:
        QWidget::geometry(*(QWidget **)(in_RDI + 0x10));
        in_stack_fffffffffffffca8 = QRect::left((QRect *)0x66a241);
        QPoint::y((QPoint *)0x66a252);
        QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                       in_stack_fffffffffffffc9c,
                       CONCAT13(in_stack_fffffffffffffc9b,
                                CONCAT12(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98)));
        QWidget::geometry(*(QWidget **)(in_RDI + 0x10));
        local_1d8 = QRect::bottomRight((QRect *)CONCAT44(in_stack_fffffffffffffc9c,
                                                         CONCAT13(in_stack_fffffffffffffc9b,
                                                                  CONCAT12(in_stack_fffffffffffffc9a
                                                                           ,
                                                  in_stack_fffffffffffffc98))));
        QRect::QRect(this_00,(QPoint *)CONCAT44(iVar2,in_stack_fffffffffffffcb8),
                     (QPoint *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
        local_148 = (undefined1 *)local_1c8;
        puStack_140 = (undefined1 *)local_1c0;
        break;
      case 6:
        QWidget::geometry(*(QWidget **)(in_RDI + 0x10));
        local_1f0 = QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffc9c,
                                                     CONCAT13(in_stack_fffffffffffffc9b,
                                                              CONCAT12(in_stack_fffffffffffffc9a,
                                                                       in_stack_fffffffffffffc98))))
        ;
        QWidget::geometry(*(QWidget **)(in_RDI + 0x10));
        in_stack_fffffffffffffca4 = QRect::right((QRect *)0x66a305);
        QPoint::y((QPoint *)0x66a316);
        QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                       in_stack_fffffffffffffc9c,
                       CONCAT13(in_stack_fffffffffffffc9b,
                                CONCAT12(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98)));
        QRect::QRect(this_00,(QPoint *)CONCAT44(iVar2,in_stack_fffffffffffffcb8),
                     (QPoint *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
        local_148 = (undefined1 *)local_1e8;
        puStack_140 = (undefined1 *)local_1e0;
        break;
      case 7:
        in_stack_fffffffffffffca0 = QPoint::x((QPoint *)0x66a378);
        QWidget::geometry(*(QWidget **)(in_RDI + 0x10));
        QRect::top((QRect *)0x66a397);
        QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                       in_stack_fffffffffffffc9c,
                       CONCAT13(in_stack_fffffffffffffc9b,
                                CONCAT12(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98)));
        QWidget::geometry(*(QWidget **)(in_RDI + 0x10));
        local_218 = QRect::bottomRight((QRect *)CONCAT44(in_stack_fffffffffffffc9c,
                                                         CONCAT13(in_stack_fffffffffffffc9b,
                                                                  CONCAT12(in_stack_fffffffffffffc9a
                                                                           ,
                                                  in_stack_fffffffffffffc98))));
        QRect::QRect(this_00,(QPoint *)CONCAT44(iVar2,in_stack_fffffffffffffcb8),
                     (QPoint *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
        local_148 = (undefined1 *)local_208;
        puStack_140 = (undefined1 *)local_200;
        break;
      case 8:
        QWidget::geometry(*(QWidget **)(in_RDI + 0x10));
        local_230 = QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffc9c,
                                                     CONCAT13(in_stack_fffffffffffffc9b,
                                                              CONCAT12(in_stack_fffffffffffffc9a,
                                                                       in_stack_fffffffffffffc98))))
        ;
        in_stack_fffffffffffffc9c = QPoint::x((QPoint *)0x66a43b);
        QWidget::geometry(*(QWidget **)(in_RDI + 0x10));
        QRect::bottom((QRect *)0x66a45a);
        QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                       in_stack_fffffffffffffc9c,
                       CONCAT13(in_stack_fffffffffffffc9b,
                                CONCAT12(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98)));
        QRect::QRect(this_00,(QPoint *)CONCAT44(iVar2,in_stack_fffffffffffffcb8),
                     (QPoint *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
        local_148 = (undefined1 *)local_228;
        puStack_140 = (undefined1 *)local_220;
      }
      local_250 = QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffc9c,
                                                   CONCAT13(in_stack_fffffffffffffc9b,
                                                            CONCAT12(in_stack_fffffffffffffc9a,
                                                                     in_stack_fffffffffffffc98))));
      local_270 = QRect::size((QRect *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0)
                             );
      local_278 = QWidget::minimumSize
                            ((QWidget *)
                             CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      local_268 = QSize::expandedTo((QSize *)CONCAT44(in_stack_fffffffffffffcac,
                                                      in_stack_fffffffffffffca8),
                                    (QSize *)CONCAT44(in_stack_fffffffffffffca4,
                                                      in_stack_fffffffffffffca0));
      QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                   in_stack_fffffffffffffc9c,
                   CONCAT13(in_stack_fffffffffffffc9b,
                            CONCAT12(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98)));
      local_260 = QSize::expandedTo((QSize *)CONCAT44(in_stack_fffffffffffffcac,
                                                      in_stack_fffffffffffffca8),
                                    (QSize *)CONCAT44(in_stack_fffffffffffffca4,
                                                      in_stack_fffffffffffffca0));
      local_258 = QSize::boundedTo((QSize *)CONCAT44(in_stack_fffffffffffffcac,
                                                     in_stack_fffffffffffffca8),
                                   (QSize *)CONCAT44(in_stack_fffffffffffffca4,
                                                     in_stack_fffffffffffffca0));
      QRect::QRect(this_00,(QPoint *)CONCAT44(iVar2,in_stack_fffffffffffffcb8),
                   (QSize *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      local_148 = (undefined1 *)local_248;
      puStack_140 = (undefined1 *)local_240;
      QWidget::geometry(*(QWidget **)(in_RDI + 0x10));
      bVar1 = ::operator!=((QRect *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                           (QRect *)CONCAT44(in_stack_fffffffffffffc9c,
                                             CONCAT13(in_stack_fffffffffffffc9b,
                                                      CONCAT12(in_stack_fffffffffffffc9a,
                                                               in_stack_fffffffffffffc98))));
      bVar9 = 0;
      if (bVar1) {
        bVar1 = QWidget::isWindow((QWidget *)
                                  CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
        bVar9 = 1;
        if (!bVar1) {
          QWidget::parentWidget((QWidget *)0x66a602);
          local_290 = QWidget::rect((QWidget *)CONCAT44(iVar2,in_stack_fffffffffffffcb8));
          bVar9 = QRect::intersects((QRect *)&local_290);
        }
      }
      if ((bVar9 & 1) != 0) {
        QWidget::setGeometry(pQVar5,r);
      }
    }
    goto LAB_0066a65e;
  }
  iVar2 = QPoint::y((QPoint *)0x66945c);
  if ((*(int *)(in_RDI + 0x3c) < iVar2) ||
     (iVar2 = QPoint::x((QPoint *)0x669476), *(int *)(in_RDI + 0x3c) < iVar2)) {
    iVar2 = QPoint::y((QPoint *)0x6694a4);
    iVar3 = QWidget::height((QWidget *)0x6694be);
    if (iVar3 - *(int *)(in_RDI + 0x3c) <= iVar2) {
      iVar2 = QPoint::x((QPoint *)0x6694e3);
      iVar3 = QWidget::width((QWidget *)0x6694fd);
      if (iVar3 - *(int *)(in_RDI + 0x3c) <= iVar2) {
        *(undefined4 *)(in_RDI + 0x30) = 2;
        goto LAB_00669770;
      }
    }
    iVar2 = QPoint::y((QPoint *)0x669536);
    iVar3 = QWidget::height((QWidget *)0x669550);
    if ((iVar2 < iVar3 - *(int *)(in_RDI + 0x3c)) ||
       (iVar2 = QPoint::x((QPoint *)0x669575), *(int *)(in_RDI + 0x3c) < iVar2)) {
      iVar2 = QPoint::y((QPoint *)0x6695a3);
      if (iVar2 <= *(int *)(in_RDI + 0x3c)) {
        iVar2 = QPoint::x((QPoint *)0x6695bd);
        iVar3 = QWidget::width((QWidget *)0x6695d7);
        if (iVar3 - *(int *)(in_RDI + 0x3c) <= iVar2) {
          *(undefined4 *)(in_RDI + 0x30) = 4;
          goto LAB_00669770;
        }
      }
      iVar2 = QPoint::y((QPoint *)0x669610);
      if (*(int *)(in_RDI + 0x3c) < iVar2) {
        iVar2 = QPoint::y((QPoint *)0x66963e);
        iVar3 = QWidget::height((QWidget *)0x669658);
        if (iVar2 < iVar3 - *(int *)(in_RDI + 0x3c)) {
          iVar2 = QPoint::x((QPoint *)0x669691);
          if (*(int *)(in_RDI + 0x3c) < iVar2) {
            iVar2 = QPoint::x((QPoint *)0x6696bf);
            iVar3 = QWidget::width((QWidget *)0x6696d9);
            if (iVar2 < iVar3 - *(int *)(in_RDI + 0x3c)) {
              local_38 = QWidget::rect((QWidget *)
                                       CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8)
                                      );
              uVar4 = QRect::contains((QPoint *)&local_38,SUB81(&local_10,0));
              if ((uVar4 & 1) == 0) {
                *(undefined4 *)(in_RDI + 0x30) = 0;
              }
              else {
                *(undefined4 *)(in_RDI + 0x30) = 9;
              }
            }
            else {
              *(undefined4 *)(in_RDI + 0x30) = 8;
            }
          }
          else {
            *(undefined4 *)(in_RDI + 0x30) = 7;
          }
        }
        else {
          *(undefined4 *)(in_RDI + 0x30) = 6;
        }
      }
      else {
        *(undefined4 *)(in_RDI + 0x30) = 5;
      }
    }
    else {
      *(undefined4 *)(in_RDI + 0x30) = 3;
    }
  }
  else {
    *(undefined4 *)(in_RDI + 0x30) = 1;
  }
LAB_00669770:
  bVar1 = QWidget::isMinimized(*(QWidget **)(in_RDI + 0x10));
  if ((bVar1) || (bVar1 = isEnabled(in_RDI), !bVar1)) {
    *(undefined4 *)(in_RDI + 0x30) = 9;
  }
  setMouseCursor((QWidgetResizeHandler *)
                 CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),m);
LAB_0066a65e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetResizeHandler::mouseMoveEvent(QMouseEvent *e)
{
    QPoint pos = widget->mapFromGlobal(e->globalPosition().toPoint());
    if (!active && !buttonDown) {
        if (pos.y() <= range && pos.x() <= range)
            mode = TopLeft;
        else if (pos.y() >= widget->height()-range && pos.x() >= widget->width()-range)
            mode = BottomRight;
        else if (pos.y() >= widget->height()-range && pos.x() <= range)
            mode = BottomLeft;
        else if (pos.y() <= range && pos.x() >= widget->width()-range)
            mode = TopRight;
        else if (pos.y() <= range)
            mode = Top;
        else if (pos.y() >= widget->height()-range)
            mode = Bottom;
        else if (pos.x() <= range)
            mode = Left;
        else if ( pos.x() >= widget->width()-range)
            mode = Right;
        else if (widget->rect().contains(pos))
            mode = Center;
        else
            mode = Nowhere;

        if (widget->isMinimized() || !isEnabled())
            mode = Center;
#ifndef QT_NO_CURSOR
        setMouseCursor(mode);
#endif
        return;
    }

    if (mode == Center)
        return;

    if (widget->testAttribute(Qt::WA_WState_ConfigPending))
        return;


    QPoint globalPos = (!widget->isWindow() && widget->parentWidget()) ?
                       widget->parentWidget()->mapFromGlobal(e->globalPosition().toPoint()) : e->globalPosition().toPoint();
    if (!widget->isWindow() && !widget->parentWidget()->rect().contains(globalPos)) {
        if (globalPos.x() < 0)
            globalPos.rx() = 0;
        if (globalPos.y() < 0)
            globalPos.ry() = 0;
        if (globalPos.x() > widget->parentWidget()->width())
            globalPos.rx() = widget->parentWidget()->width();
        if (globalPos.y() > widget->parentWidget()->height())
            globalPos.ry() = widget->parentWidget()->height();
    }

    QPoint p = globalPos + invertedMoveOffset;
    QPoint pp = globalPos - moveOffset;

    // Workaround for window managers which refuse to move a tool window partially offscreen.
    if (QGuiApplication::platformName() == "xcb"_L1) {
        const QRect desktop = QWidgetPrivate::availableScreenGeometry(widget);
        pp.rx() = qMax(pp.x(), desktop.left());
        pp.ry() = qMax(pp.y(), desktop.top());
        p.rx() = qMin(p.x(), desktop.right());
        p.ry() = qMin(p.y(), desktop.bottom());
    }

    QSize ms = qSmartMinSize(childWidget);
    int mw = ms.width();
    int mh = ms.height();
    if (childWidget != widget) {
        mw += 2 * fw;
        mh += 2 * fw + extrahei;
    }

    QSize maxsize(childWidget->maximumSize());
    if (childWidget != widget)
        maxsize += QSize(2 * fw, 2 * fw + extrahei);
    QSize mpsize(widget->geometry().right() - pp.x() + 1,
                  widget->geometry().bottom() - pp.y() + 1);
    mpsize = mpsize.expandedTo(widget->minimumSize()).expandedTo(QSize(mw, mh))
                    .boundedTo(maxsize);
    QPoint mp(widget->geometry().right() - mpsize.width() + 1,
               widget->geometry().bottom() - mpsize.height() + 1);

    QRect geom = widget->geometry();

    switch (mode) {
    case TopLeft:
        geom = QRect(mp, widget->geometry().bottomRight()) ;
        break;
    case BottomRight:
        geom = QRect(widget->geometry().topLeft(), p) ;
        break;
    case BottomLeft:
        geom = QRect(QPoint(mp.x(), widget->geometry().y()), QPoint(widget->geometry().right(), p.y())) ;
        break;
    case TopRight:
        geom = QRect(QPoint(widget->geometry().x(), mp.y()), QPoint(p.x(), widget->geometry().bottom())) ;
        break;
    case Top:
        geom = QRect(QPoint(widget->geometry().left(), mp.y()), widget->geometry().bottomRight()) ;
        break;
    case Bottom:
        geom = QRect(widget->geometry().topLeft(), QPoint(widget->geometry().right(), p.y())) ;
        break;
    case Left:
        geom = QRect(QPoint(mp.x(), widget->geometry().top()), widget->geometry().bottomRight()) ;
        break;
    case Right:
        geom = QRect(widget->geometry().topLeft(), QPoint(p.x(), widget->geometry().bottom())) ;
        break;
    default:
        break;
    }

    geom = QRect(geom.topLeft(),
                  geom.size().expandedTo(widget->minimumSize())
                             .expandedTo(QSize(mw, mh))
                             .boundedTo(maxsize));

    if (geom != widget->geometry() &&
        (widget->isWindow() || widget->parentWidget()->rect().intersects(geom))) {
        widget->setGeometry(geom);
    }
}